

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * BiCGSTABIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                     double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim_00;
  Vector *pVVar3;
  Vector *pVVar4;
  double bNorm_00;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 local_1f8 [8];
  Vector t;
  Vector s_;
  Vector s;
  Vector v;
  Vector p_;
  Vector p;
  Vector r_;
  Vector r;
  size_t Dim;
  double bNorm;
  double Omega;
  double RhoOld;
  double Rho;
  double Beta;
  double Alpha;
  int Iter;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  Beta = 0.0;
  Omega = 0.0;
  bNorm = 0.0;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim_00 = Q_GetDim(A);
  V_Constr((Vector *)&r_.Cmp,"r",Dim_00,Normal,True);
  V_Constr((Vector *)&p.Cmp,"r_",Dim_00,Normal,True);
  V_Constr((Vector *)&p_.Cmp,"p",Dim_00,Normal,True);
  V_Constr((Vector *)&s.Cmp,"v",Dim_00,Normal,True);
  V_Constr((Vector *)&s_.Cmp,"s",Dim_00,Normal,True);
  V_Constr((Vector *)local_1f8,"t",Dim_00,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr((Vector *)&v.Cmp,"p_",Dim_00,Normal,True);
    V_Constr((Vector *)&t.Cmp,"s_",Dim_00,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    Alpha._4_4_ = 0;
    dVar5 = l1Norm_V(x);
    auVar8._8_4_ = (int)(Dim_00 >> 0x20);
    auVar8._0_8_ = Dim_00;
    auVar8._12_4_ = 0x45300000;
    if (ABS(dVar5 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)&r_.Cmp,b);
    }
    else {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)&r_.Cmp,pVVar3);
    }
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      Asgn_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
      do {
        dVar5 = l2Norm_V((Vector *)&r_.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar5,bNorm_00,BiCGSTABIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        dVar5 = Mul_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
        if (ABS(dVar5) < 2.2250738585072014e-307) {
          LASError(LASBreakdownErr,"BiCGSTABIter","Rho",(char *)0x0,(char *)0x0);
          break;
        }
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&p_.Cmp,(Vector *)&r_.Cmp);
        }
        else {
          pVVar3 = Mul_SV(bNorm,(Vector *)&s.Cmp);
          pVVar3 = Sub_VV((Vector *)&p_.Cmp,pVVar3);
          pVVar3 = Mul_SV((dVar5 / Omega) * (Beta / bNorm),pVVar3);
          pVVar3 = Add_VV((Vector *)&r_.Cmp,pVVar3);
          Asgn_VV((Vector *)&p_.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&p_.Cmp);
        Asgn_VV((Vector *)&s.Cmp,pVVar3);
        dVar6 = Mul_VV((Vector *)&p.Cmp,(Vector *)&s.Cmp);
        Beta = dVar5 / dVar6;
        pVVar3 = Mul_SV(Beta,(Vector *)&s.Cmp);
        pVVar3 = Sub_VV((Vector *)&r_.Cmp,pVVar3);
        Asgn_VV((Vector *)&s_.Cmp,pVVar3);
        pVVar3 = Mul_QV(A,(Vector *)&s_.Cmp);
        Asgn_VV((Vector *)local_1f8,pVVar3);
        dVar6 = Mul_VV((Vector *)local_1f8,(Vector *)&s_.Cmp);
        dVar7 = l2Norm_V((Vector *)local_1f8);
        dVar7 = pow(dVar7,2.0);
        bNorm = dVar6 / dVar7;
        pVVar3 = Mul_SV(Beta,(Vector *)&p_.Cmp);
        pVVar4 = Mul_SV(bNorm,(Vector *)&s_.Cmp);
        pVVar3 = Add_VV(pVVar3,pVVar4);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(bNorm,(Vector *)local_1f8);
        pVVar3 = Sub_VV((Vector *)&s_.Cmp,pVVar3);
        Asgn_VV((Vector *)&r_.Cmp,pVVar3);
        Omega = dVar5;
      } while (2.2250738585072014e-307 <= ABS(bNorm));
    }
    else {
      Asgn_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
      do {
        dVar5 = l2Norm_V((Vector *)&r_.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar5,bNorm_00,BiCGSTABIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        dVar5 = Mul_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
        if (ABS(dVar5) < 2.2250738585072014e-307) {
          LASError(LASBreakdownErr,"BiCGSTABIter","Rho",(char *)0x0,(char *)0x0);
          break;
        }
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&p_.Cmp,(Vector *)&r_.Cmp);
        }
        else {
          pVVar3 = Mul_SV(bNorm,(Vector *)&s.Cmp);
          pVVar3 = Sub_VV((Vector *)&p_.Cmp,pVVar3);
          pVVar3 = Mul_SV((dVar5 / Omega) * (Beta / bNorm),pVVar3);
          pVVar3 = Add_VV((Vector *)&r_.Cmp,pVVar3);
          Asgn_VV((Vector *)&p_.Cmp,pVVar3);
        }
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)&v.Cmp,(Vector *)&p_.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)&v.Cmp,(Vector *)&p_.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)&v.Cmp,A);
        }
        pVVar3 = Mul_QV(A,(Vector *)&v.Cmp);
        Asgn_VV((Vector *)&s.Cmp,pVVar3);
        dVar6 = Mul_VV((Vector *)&p.Cmp,(Vector *)&s.Cmp);
        Beta = dVar5 / dVar6;
        pVVar3 = Mul_SV(Beta,(Vector *)&s.Cmp);
        pVVar3 = Sub_VV((Vector *)&r_.Cmp,pVVar3);
        Asgn_VV((Vector *)&s_.Cmp,pVVar3);
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)&t.Cmp,(Vector *)&s_.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)&t.Cmp,(Vector *)&s_.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)&t.Cmp,A);
        }
        pVVar3 = Mul_QV(A,(Vector *)&t.Cmp);
        Asgn_VV((Vector *)local_1f8,pVVar3);
        dVar6 = Mul_VV((Vector *)local_1f8,(Vector *)&s_.Cmp);
        dVar7 = l2Norm_V((Vector *)local_1f8);
        dVar7 = pow(dVar7,2.0);
        bNorm = dVar6 / dVar7;
        pVVar3 = Mul_SV(Beta,(Vector *)&v.Cmp);
        pVVar4 = Mul_SV(bNorm,(Vector *)&t.Cmp);
        pVVar3 = Add_VV(pVVar3,pVVar4);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(bNorm,(Vector *)local_1f8);
        pVVar3 = Sub_VV((Vector *)&s_.Cmp,pVVar3);
        Asgn_VV((Vector *)&r_.Cmp,pVVar3);
        Omega = dVar5;
      } while (2.2250738585072014e-307 <= ABS(bNorm));
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr((Vector *)&r_.Cmp);
  V_Destr((Vector *)&p.Cmp);
  V_Destr((Vector *)&p_.Cmp);
  V_Destr((Vector *)&s.Cmp);
  V_Destr((Vector *)&s_.Cmp);
  V_Destr((Vector *)local_1f8);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr((Vector *)&v.Cmp);
    V_Destr((Vector *)&t.Cmp);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *BiCGSTABIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha = 0.0, Beta, Rho, RhoOld = 0.0, Omega = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, v, s, s_, t;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&v, "v", Dim, Normal, True);
    V_Constr(&s, "s", Dim, Normal, True);
    V_Constr(&t, "t", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Constr(&p_, "p_", Dim, Normal, True);
        V_Constr(&s_, "s_", Dim, Normal, True);
    }
    
    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned BiCGStab */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGSTABIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGSTABIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = (Rho / RhoOld) * (Alpha / Omega);
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, Sub_VV(&p, Mul_SV(Omega, &v)))));
                }
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &p_, &p, OmegaPrecond);
	        else
		    Asgn_VV(&p_, &p);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&p_, A);
                Asgn_VV(&v, Mul_QV(A, &p_));
                Alpha = Rho / Mul_VV(&r_, &v);
                Asgn_VV(&s, Sub_VV(&r, Mul_SV(Alpha, &v)));
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &s_, &s, OmegaPrecond);
	        else
		    Asgn_VV(&s_, &s);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&s_, A);
                Asgn_VV(&t, Mul_QV(A, &s_));
                Omega = Mul_VV(&t, &s) / pow(l2Norm_V(&t), 2.0);
                AddAsgn_VV(x, Add_VV(Mul_SV(Alpha, &p_), Mul_SV(Omega, &s_)));
                Asgn_VV(&r, Sub_VV(&s, Mul_SV(Omega, &t)));
                RhoOld = Rho;
                if (IsZero(Omega))
                    break;
            }
        } else {
            /* plain BiCGStab (p_ = p) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGSTABIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGSTABIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = (Rho / RhoOld) * (Alpha / Omega);
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, Sub_VV(&p, Mul_SV(Omega, &v)))));
                }
                Asgn_VV(&v, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&r_, &v);
                Asgn_VV(&s, Sub_VV(&r, Mul_SV(Alpha, &v)));
                Asgn_VV(&t, Mul_QV(A, &s));
                Omega = Mul_VV(&t, &s) / pow(l2Norm_V(&t), 2.0);
                AddAsgn_VV(x, Add_VV(Mul_SV(Alpha, &p), Mul_SV(Omega, &s)));
                Asgn_VV(&r, Sub_VV(&s, Mul_SV(Omega, &t)));
                RhoOld = Rho;
                if (IsZero(Omega))
                    break;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&v);
    V_Destr(&s);
    V_Destr(&t);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Destr(&p_);
        V_Destr(&s_);
    }
    
    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}